

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O0

string * __thiscall FastPForLib::VarIntG8IU::name_abi_cxx11_(VarIntG8IU *this)

{
  string *in_RDI;
  allocator local_11 [17];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"VarIntG8IU",local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

virtual std::string name() const { return std::string("VarIntG8IU"); }